

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O3

Node * __thiscall SplayTree::splay(SplayTree *this,int value,Node *root)

{
  Node *pNVar1;
  Node *k1;
  Node *pNVar2;
  Node *pNVar3;
  Node **ppNVar4;
  Node header;
  
  if (root == (Node *)0x0) {
    return (Node *)0x0;
  }
  pNVar2 = &header;
  header.leftChild = (Node *)0x0;
  header.rightChild = (Node *)0x0;
  pNVar3 = pNVar2;
  do {
    if (value < root->value) {
      pNVar1 = root->leftChild;
      if (pNVar1 == (Node *)0x0) goto LAB_00107938;
      if (value < pNVar1->value) {
        root->leftChild = pNVar1->rightChild;
        pNVar1->rightChild = root;
        root = pNVar1;
        if (pNVar1->leftChild == (Node *)0x0) goto LAB_00107938;
      }
      pNVar3->leftChild = root;
      ppNVar4 = &root->leftChild;
      pNVar3 = root;
    }
    else {
      if ((value <= root->value) || (pNVar1 = root->rightChild, pNVar1 == (Node *)0x0)) {
LAB_00107938:
        pNVar2->rightChild = root->leftChild;
        pNVar3->leftChild = root->rightChild;
        root->leftChild = header.rightChild;
        root->rightChild = header.leftChild;
        return root;
      }
      if (pNVar1->value < value) {
        root->rightChild = pNVar1->leftChild;
        pNVar1->leftChild = root;
        root = pNVar1;
        if (pNVar1->rightChild == (Node *)0x0) goto LAB_00107938;
      }
      pNVar2->rightChild = root;
      ppNVar4 = &root->rightChild;
      pNVar2 = root;
    }
    root = *ppNVar4;
    *ppNVar4 = (Node *)0x0;
  } while( true );
}

Assistant:

SplayTree::Node *SplayTree::splay(int value, Node *root) {
    if (!root) {
        return nullptr;
    }
    Node header{};
    /* header.rChild points to L tree; header.lChild points to R Tree */
    header.leftChild = header.rightChild = nullptr;
    Node *LeftTreeMax = &header;
    Node *RightTreeMin = &header;

    /* loop until root->lChild == NULL || root->rChild == NULL; then break!
       (or when find the key, break too.)
     The zig/zag mode would only happen when cannot find key and will reach
     null on one side after RR or LL Rotation.
     */
    while (true) {
        if (value < root->value) {
            if (!root->leftChild) {
                break;
            }
            if (value < root->leftChild->value) {
                root = rightRotate(root); /* only zig-zig mode need to rotate once,
										   because zig-zag mode is handled as zig
										   mode, which doesn't require rotate,
										   just linking it to R Tree */
                if (!root->leftChild) {
                    break;
                }
            }
            /* Link to R Tree */
            RightTreeMin->leftChild = root;
            RightTreeMin = RightTreeMin->leftChild;
            root = root->leftChild;
            RightTreeMin->leftChild = nullptr;
        } else if (value > root->value) {
            if (!root->rightChild) {
                break;
            }
            if (value > root->rightChild->value) {
                root = leftRotate(root);/* only zag-zag mode need to rotate once,
										  because zag-zig mode is handled as zag
										  mode, which doesn't require rotate,
										  just linking it to L Tree */
                if (!root->rightChild) {
                    break;
                }
            }
            /* Link to L Tree */
            LeftTreeMax->rightChild = root;
            LeftTreeMax = LeftTreeMax->rightChild;
            root = root->rightChild;
            LeftTreeMax->rightChild = nullptr;
        } else {
            break;
        }
    }
    /* assemble L Tree, Middle Tree and R tree together */
    LeftTreeMax->rightChild = root->leftChild;
    RightTreeMin->leftChild = root->rightChild;
    root->leftChild = header.rightChild;
    root->rightChild = header.leftChild;

    return root;
}